

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__COLLADA
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ENUM__version_enum EVar2;
  long *in_RSI;
  ParserTemplateBase *in_RDI;
  StringHashPair SVar3;
  StringHashPair hashPair;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  COLLADA__AttributeData *attributeData;
  URI *in_stack_fffffffffffffd98;
  URI *other;
  URI *in_stack_fffffffffffffda0;
  void **in_stack_fffffffffffffda8;
  pair<unsigned_long,_COLLADASaxFWL15::ENUM__version_enum> *in_stack_fffffffffffffdb8;
  bool *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  StringHash in_stack_fffffffffffffe98;
  URI local_140;
  byte local_52;
  byte local_51;
  undefined8 local_50;
  StringHash local_48;
  ParserChar *local_40;
  undefined8 *local_38;
  COLLADA__AttributeData *local_30;
  long *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_30 = GeneratedSaxParser::ParserTemplateBase::
             newData<COLLADASaxFWL15::COLLADA__AttributeData>(in_RDI,in_stack_fffffffffffffda8);
  local_38 = (undefined8 *)*local_18;
  if (local_38 == (undefined8 *)0x0) {
LAB_009ba0fb:
    if ((local_30->present_attributes & 1) == 0) {
      other = (URI *)&stack0xfffffffffffffdb8;
      COLLADABU::URI::URI((URI *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
      COLLADABU::URI::operator=(in_stack_fffffffffffffda0,other);
      COLLADABU::URI::~URI(in_stack_fffffffffffffda0);
    }
    if ((local_30->version == ENUM__version_enum__NOT_PRESENT) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc
                           ,in_stack_fffffffffffffdc8,(StringHash)in_stack_fffffffffffffdc0,
                           (StringHash)in_stack_fffffffffffffdb8,(ParserChar *)in_RDI), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        while( true ) {
          do {
            local_40 = (ParserChar *)*local_38;
            if (local_40 == (ParserChar *)0x0) {
              local_40 = (ParserChar *)0x0;
              goto LAB_009ba0fb;
            }
            local_48 = GeneratedSaxParser::Utils::calculateStringHash(local_40);
            if (local_38 + 1 == (undefined8 *)0x0) {
              return false;
            }
            local_50 = local_38[1];
            local_38 = local_38 + 2;
          } while (local_48 == 0x7f4353);
          if (local_48 != 0x4008f65) break;
          in_stack_fffffffffffffda0 = &local_140;
          GeneratedSaxParser::Utils::toURI
                    ((ParserChar **)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     in_stack_fffffffffffffdc0);
          COLLADABU::URI::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
          COLLADABU::URI::~URI(in_stack_fffffffffffffda0);
          if (((local_52 & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)in_stack_fffffffffffffdd0,
                                 in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                                 (StringHash)in_stack_fffffffffffffdc0,
                                 (StringHash)in_stack_fffffffffffffdb8,(ParserChar *)in_RDI), bVar1)
             ) {
            return false;
          }
          if ((local_52 & 1) == 0) {
            local_30->present_attributes = local_30->present_attributes | 1;
          }
        }
        if (local_48 != 0xcc9a02e) break;
        EVar2 = GeneratedSaxParser::Utils::
                toEnum<COLLADASaxFWL15::ENUM__version_enum,_unsigned_long,_(COLLADASaxFWL15::ENUM__version_enum)1>
                          ((ParserChar *)
                           CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                           in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                           (_func_unsigned_long_ParserChar_ptr_bool_ptr *)in_RDI);
        local_30->version = EVar2;
        if (((local_51 & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)in_stack_fffffffffffffdd0,
                               in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                               (StringHash)in_stack_fffffffffffffdc0,
                               (StringHash)in_stack_fffffffffffffdb8,(ParserChar *)in_RDI), bVar1))
        {
          return false;
        }
      }
      SVar3 = GeneratedSaxParser::Utils::calculateStringHashWithNamespace((ParserChar *)in_RDI);
    } while ((SVar3.first == 0x7f4353) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               ((ParserTemplateBase *)SVar3.second,SVar3.first._4_4_,
                                (ErrorType)SVar3.first,in_stack_fffffffffffffe98,
                                (ParserChar *)in_stack_fffffffffffffe90,
                                (ParserChar *)in_stack_fffffffffffffe88), !bVar1));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__COLLADA( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__COLLADA( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

COLLADA__AttributeData* attributeData = newData<COLLADA__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VERSION:
    {
bool failed;
attributeData->version = Utils::toEnum<ENUM__version_enum, StringHash, ENUM__version_enum__COUNT>(attributeValue, failed, ENUM__version_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_COLLADA,
        HASH_ATTRIBUTE_VERSION,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_BASE:
    {
bool failed;
attributeData->base = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_COLLADA,
        HASH_ATTRIBUTE_BASE,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= COLLADA__AttributeData::ATTRIBUTE_BASE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_XMLNS:
    {
    // ignore

    break;
    }
    default:
    {
        StringHashPair hashPair = Utils::calculateStringHashWithNamespace( attribute );
        if ( hashPair.first != HASH_ATTRIBUTE_XMLNS )
        {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_COLLADA, attribute, attributeValue))
            {return false;}        }
        else
        {
            // ignore
        }

    }
    }
    }
}
if ((attributeData->present_attributes & COLLADA__AttributeData::ATTRIBUTE_BASE_PRESENT) == 0)
{
    attributeData->base = COLLADABU::URI("");
}
if ( attributeData->version == ENUM__version_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_COLLADA, HASH_ATTRIBUTE_VERSION, 0 ) )
        return false;
}


    return true;
}